

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall NaStateSpaceModel::Clean(NaStateSpaceModel *this)

{
  NaReal *pNVar1;
  
  NaMatrix::new_dim(&this->A,1,1);
  NaMatrix::new_dim(&this->B,1,1);
  NaMatrix::new_dim(&this->C,1,1);
  NaMatrix::new_dim(&this->D,1,1);
  this->k = 1;
  this->n = 1;
  this->m = 1;
  NaUnit::Assign(&this->super_NaUnit,1,1,0);
  pNVar1 = NaMatrix::fetch(&this->A,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->B,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->C,0,0);
  *pNVar1 = 0.0;
  pNVar1 = NaMatrix::fetch(&this->D,0,0);
  *pNVar1 = 0.0;
  return;
}

Assistant:

void
NaStateSpaceModel::Clean ()
{
    A.new_dim(1, 1);
    B.new_dim(1, 1);
    C.new_dim(1, 1);
    D.new_dim(1, 1);

    n = m = k = 1;
    Assign(k, m);

    A.fetch(0,0) = 0.0;
    B.fetch(0,0) = 0.0;
    C.fetch(0,0) = 0.0;
    D.fetch(0,0) = 0.0;
}